

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O3

string * GetUnit_abi_cxx11_(string *__return_storage_ptr__,U8 *pItem)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(uint *)(pItem + 1);
  if ((uVar1 & 0xf0) == 0) {
    if ((uVar1 & 0xf00) == 0) {
      if ((uVar1 & 0xf000) != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "Second";
        pcVar2 = "";
        goto LAB_0012a880;
      }
      if ((uVar1 & 0xf0000) == 0) {
        if ((uVar1 & 0xf00000) != 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "Ampere";
          pcVar2 = "";
          goto LAB_0012a880;
        }
        if ((uVar1 & 0xf000000) != 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "Candela";
          pcVar2 = "";
          goto LAB_0012a880;
        }
      }
      else {
        if ((uVar1 & 0xf) - 1 < 2) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "Kelvin";
          pcVar2 = "";
          goto LAB_0012a880;
        }
        if ((uVar1 & 0xf) - 3 < 2) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "Fahrenheit";
          pcVar2 = "";
          goto LAB_0012a880;
        }
      }
    }
    else {
      if ((uVar1 & 0xf) - 1 < 2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "Gram";
        pcVar2 = "";
        goto LAB_0012a880;
      }
      if ((uVar1 & 0xf) - 3 < 2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "Slug";
        pcVar2 = "";
        goto LAB_0012a880;
      }
    }
switchD_0012a702_default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Undefined Unit";
    pcVar2 = "";
  }
  else {
    switch(uVar1 & 0xf) {
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Centimeter";
      pcVar2 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Radian";
      pcVar2 = "";
      break;
    case 3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Inch";
      pcVar2 = "";
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Degree";
      pcVar2 = "";
      break;
    default:
      goto switchD_0012a702_default;
    }
  }
LAB_0012a880:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetUnit( const U8* pItem )
{
    U32 val = *( U32* )( pItem + 1 );

    U8 firstNibble = val & 0x0f;

    // branch by quality measures
    if( val & 0x000000f0 ) // Length
    {
        switch( firstNibble )
        {
        case 1:
            return "Centimeter";
        case 2:
            return "Radian";
        case 3:
            return "Inch";
        case 4:
            return "Degree";
        }
    }
    else if( val & 0x00000f00 )
    { // Mass

        if( firstNibble == 1 || firstNibble == 2 )
            return "Gram";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Slug";
    }
    else if( val & 0x0000f000 )
    { // Time

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Second";
    }
    else if( val & 0x000f0000 )
    { // Temperature

        if( firstNibble == 1 || firstNibble == 2 )
            return "Kelvin";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Fahrenheit";
    }
    else if( val & 0x00f00000 )
    { // Current

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Ampere";
    }
    else if( val & 0x0f000000 )
    { // Luminosity

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Candela";
    }

    return "Undefined Unit";
}